

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseConst(WastParser *this,Const *const_,ConstType const_type)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Enum EVar2;
  TokenType TVar3;
  Literal *pLVar4;
  char *format;
  ParseIntType in_R8D;
  string_view v;
  string_view v_00;
  string *local_268;
  string local_250;
  size_t local_230;
  char *local_228;
  size_t local_220;
  undefined8 local_218;
  undefined4 local_20c;
  Enum local_208;
  Enum local_204;
  Enum local_200;
  Enum local_1fc;
  wabt *local_1f8;
  char *local_1f0;
  Enum local_1e4;
  uint64_t local_1e0;
  uint64_t u64;
  string_view sv_1;
  Token token_2;
  uint32_t local_174;
  wabt *pwStack_170;
  uint32_t u32;
  string_view sv;
  Token token_1;
  Result result;
  iterator local_f8;
  size_type local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  undefined1 local_d0 [8];
  Token token;
  char *local_88;
  size_t local_80;
  undefined8 local_78;
  Opcode local_6c;
  undefined1 local_68 [4];
  Opcode opcode;
  Token opcode_token;
  ConstType const_type_local;
  Const *const__local;
  WastParser *this_local;
  
  Consume((Token *)local_68,this);
  local_6c = Token::opcode((Token *)local_68);
  GetLocation((Location *)&token.field_2.literal_.text._M_str,this);
  (const_->loc).filename._M_len = (size_t)token.field_2.literal_.text._M_str;
  (const_->loc).filename._M_str = local_88;
  (const_->loc).field_1.field_1.offset = local_80;
  *(undefined8 *)((long)&(const_->loc).field_1 + 8) = local_78;
  GetToken((Token *)local_d0,this);
  EVar2 = Opcode::operator_cast_to_Enum(&local_6c);
  if (((EVar2 == V128Const) ||
      (TVar3 = Token::token_type((Token *)local_d0), TVar3 - NanArithmetic < 2)) ||
     (TVar3 - First_Literal < 3)) {
    Result::Result((Result *)&token_1.field_2.literal_.text._M_str);
    EVar2 = Opcode::operator_cast_to_Enum(&local_6c);
    if (EVar2 == I32Const) {
      Consume((Token *)&sv._M_str,this);
      bVar1 = Token::HasLiteral((Token *)&sv._M_str);
      if (!bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      pLVar4 = Token::literal((Token *)&sv._M_str);
      pwStack_170 = (wabt *)(pLVar4->text)._M_len;
      sv._M_len = (size_t)(pLVar4->text)._M_str;
      v._M_str = (char *)&local_174;
      v._M_len = sv._M_len;
      token_1.field_2._16_4_ = ParseInt32(pwStack_170,v,(uint32_t *)0x1,in_R8D);
      Const::set_u32(const_,local_174);
    }
    else if (EVar2 == I64Const) {
      Consume((Token *)&sv_1._M_str,this);
      bVar1 = Token::HasLiteral((Token *)&sv_1._M_str);
      if (!bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      pLVar4 = Token::literal((Token *)&sv_1._M_str);
      local_1f8 = (wabt *)(pLVar4->text)._M_len;
      local_1f0 = (pLVar4->text)._M_str;
      v_00._M_str = (char *)&local_1e0;
      v_00._M_len = (size_t)local_1f0;
      u64 = (uint64_t)local_1f8;
      sv_1._M_len = (size_t)local_1f0;
      local_1e4 = (Enum)ParseInt64(local_1f8,v_00,(uint64_t *)0x1,in_R8D);
      token_1.field_2._16_4_ = local_1e4;
      Const::set_u64(const_,local_1e0);
    }
    else if (EVar2 == F32Const) {
      local_1fc = (Enum)ParseF32(this,const_,const_type);
      token_1.field_2._16_4_ = local_1fc;
    }
    else if (EVar2 == F64Const) {
      local_200 = (Enum)ParseF64(this,const_,const_type);
      token_1.field_2._16_4_ = local_200;
    }
    else {
      if (EVar2 != V128Const) {
        __assert_fail("!\"ParseConst called with invalid opcode\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                      ,0xab2,"Result wabt::WastParser::ParseConst(Const *, ConstType)");
      }
      ErrorUnlessOpcodeEnabled(this,(Token *)local_68);
      TVar3 = Token::token_type((Token *)local_d0);
      local_208 = (Enum)ParseSimdV128Const(this,const_,TVar3,const_type);
      local_204 = local_208;
      token_1.field_2._16_4_ = local_208;
      bVar1 = Failed((Result)local_208);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
    }
    local_20c = token_1.field_2._16_4_;
    bVar1 = Failed((Result)token_1.field_2._16_4_);
    if (bVar1) {
      local_230 = (const_->loc).filename._M_len;
      local_228 = (const_->loc).filename._M_str;
      local_220 = (const_->loc).field_1.field_1.offset;
      local_218 = *(undefined8 *)((long)&(const_->loc).field_1 + 8);
      Token::to_string_abi_cxx11_(&local_250,(Token *)local_d0);
      format = (char *)std::__cxx11::string::c_str();
      Error(this,0x221636,format);
      std::__cxx11::string::~string((string *)&local_250);
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,"a numeric literal",
               (allocator<char> *)((long)&token_1.field_2.literal_.text._M_str + 7));
    local_f8 = (iterator)&result;
    local_f0 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&token_1.field_2.literal_.text._M_str + 6));
    __l._M_len = local_f0;
    __l._M_array = local_f8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_e8,__l,(allocator_type *)((long)&token_1.field_2.literal_.text._M_str + 6));
    this_local._4_4_ = ErrorExpected(this,&local_e8,"123, -45, 6.7e8");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_e8);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&token_1.field_2.literal_.text._M_str + 6));
    local_268 = (string *)&local_f8;
    do {
      local_268 = local_268 + -0x20;
      std::__cxx11::string::~string(local_268);
    } while (local_268 != (string *)&result);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&token_1.field_2.literal_.text._M_str + 7));
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseConst(Const* const_, ConstType const_type) {
  WABT_TRACE(ParseConst);
  Token opcode_token = Consume();
  Opcode opcode = opcode_token.opcode();
  const_->loc = GetLocation();
  Token token = GetToken();

  // V128 is fully handled by ParseSimdV128Const:
  if (opcode != Opcode::V128Const) {
    switch (token.token_type()) {
      case TokenType::Nat:
      case TokenType::Int:
      case TokenType::Float:
        // OK.
        break;
      case TokenType::NanArithmetic:
      case TokenType::NanCanonical:
        break;
      default:
        return ErrorExpected({"a numeric literal"}, "123, -45, 6.7e8");
    }
  }

  Result result;
  switch (opcode) {
    case Opcode::I32Const: {
      auto token = Consume();
      if (!token.HasLiteral()) {
        return Result::Error;
      }
      auto sv = token.literal().text;
      uint32_t u32;
      result = ParseInt32(sv, &u32, ParseIntType::SignedAndUnsigned);
      const_->set_u32(u32);
      break;
    }

    case Opcode::I64Const: {
      auto token = Consume();
      if (!token.HasLiteral()) {
        return Result::Error;
      }
      auto sv = token.literal().text;
      uint64_t u64;
      result = ParseInt64(sv, &u64, ParseIntType::SignedAndUnsigned);
      const_->set_u64(u64);
      break;
    }

    case Opcode::F32Const:
      result = ParseF32(const_, const_type);
      break;

    case Opcode::F64Const:
      result = ParseF64(const_, const_type);
      break;

    case Opcode::V128Const:
      ErrorUnlessOpcodeEnabled(opcode_token);
      // Parse V128 Simd Const (16 bytes).
      result = ParseSimdV128Const(const_, token.token_type(), const_type);
      // ParseSimdV128Const report error already, just return here if parser get
      // errors.
      if (Failed(result)) {
        return Result::Error;
      }
      break;

    default:
      assert(!"ParseConst called with invalid opcode");
      return Result::Error;
  }

  if (Failed(result)) {
    Error(const_->loc, "invalid literal \"%s\"", token.to_string().c_str());
    // Return if parser get errors.
    return Result::Error;
  }

  return Result::Ok;
}